

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int GetColorPalette(WebPPicture *pic,uint32_t *palette)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint8_t in_use [1024];
  uint32_t colors [1024];
  char local_1418 [1024];
  uint local_1018 [1024];
  
  iVar10 = 0;
  memset(local_1418,0,0x400);
  memset(local_1018,0,0x1000);
  iVar1 = pic->height;
  if (0 < iVar1) {
    uVar2 = pic->width;
    puVar5 = pic->argb;
    uVar8 = ~*puVar5;
    iVar10 = 0;
    iVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          uVar3 = puVar5[uVar7];
          if (uVar3 != uVar8) {
            for (uVar9 = uVar3 * 0x1e35a7bd >> 0x16; uVar8 = uVar3, local_1418[uVar9] != '\0';
                uVar9 = uVar9 + 1 & 0x3ff) {
              if (local_1018[uVar9] == uVar3) goto LAB_0013f8b3;
            }
            local_1018[uVar9] = uVar3;
            local_1418[uVar9] = '\x01';
            if (0xff < iVar10) {
              return 0x101;
            }
            iVar10 = iVar10 + 1;
          }
LAB_0013f8b3:
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      puVar5 = puVar5 + pic->argb_stride;
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar1);
  }
  if (palette != (uint32_t *)0x0) {
    lVar4 = 0;
    iVar10 = 0;
    do {
      if (local_1418[lVar4] != '\0') {
        palette[iVar10] = local_1018[lVar4];
        iVar10 = iVar10 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x400);
    qsort(palette,(long)iVar10,4,PaletteCompareColorsForQsort);
  }
  return iVar10;
}

Assistant:

int GetColorPalette(const WebPPicture* const pic, uint32_t* const palette) {
  int i;
  int x, y;
  int num_colors = 0;
  uint8_t in_use[COLOR_HASH_SIZE] = {0};
  uint32_t colors[COLOR_HASH_SIZE] = {0};
  const uint32_t* argb = pic->argb;
  const int width = pic->width;
  const int height = pic->height;
  uint32_t last_pix = ~argb[0];  // so we're sure that last_pix != argb[0]
  assert(pic != NULL);
  assert(pic->use_argb);

  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      int key;
      if (argb[x] == last_pix) {
        continue;
      }
      last_pix = argb[x];
      key = VP8LHashPix(last_pix, COLOR_HASH_RIGHT_SHIFT);
      while (1) {
        if (!in_use[key]) {
          colors[key] = last_pix;
          in_use[key] = 1;
          ++num_colors;
          if (num_colors > MAX_PALETTE_SIZE) {
            return MAX_PALETTE_SIZE + 1;  // Exact count not needed.
          }
          break;
        } else if (colors[key] == last_pix) {
          break;  // The color is already there.
        } else {
          // Some other color sits here, so do linear conflict resolution.
          ++key;
          key &= (COLOR_HASH_SIZE - 1);  // Key mask.
        }
      }
    }
    argb += pic->argb_stride;
  }

  if (palette != NULL) {  // Fill the colors into palette.
    num_colors = 0;
    for (i = 0; i < COLOR_HASH_SIZE; ++i) {
      if (in_use[i]) {
        palette[num_colors] = colors[i];
        ++num_colors;
      }
    }
    qsort(palette, num_colors, sizeof(*palette), PaletteCompareColorsForQsort);
  }
  return num_colors;
}